

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (this->cs_ != None) {
    bVar2 = Value::hasComment(root,commentAfterOnSameLine);
    if (bVar2) {
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
      std::operator+(&local_60," ",&local_40);
      std::operator<<(poVar1,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar2 = Value::hasComment(root,commentAfter);
    if (bVar2) {
      writeIndent(this);
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_60,root,commentAfter);
      std::operator<<(poVar1,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}